

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::GPUShaderFP64Test1::verifyErrorGenerationWhenUniformFunctionsCalledWithoutActivePO
          (GPUShaderFP64Test1 *this)

{
  GPUShaderFP64Test1 *this_00;
  int iVar1;
  undefined4 extraout_var;
  char *__s;
  size_t sVar3;
  TestError *this_01;
  long lVar4;
  _uniform_function func;
  undefined8 *puVar5;
  undefined8 *puVar6;
  GPUShaderFP64Test1 *this_02;
  bool bVar7;
  byte bVar8;
  double data [15];
  undefined8 auStack_228 [15];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar2;
  
  bVar8 = 0;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  this_00 = (GPUShaderFP64Test1 *)(local_1b0 + 8);
  func = UNIFORM_FUNCTION_1D;
  bVar7 = true;
  do {
    puVar5 = &DAT_01a888e0;
    puVar6 = auStack_228;
    for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar6 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
      puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
    }
    switch(func) {
    case UNIFORM_FUNCTION_1D:
      (**(code **)(lVar2 + 0x14d0))(0,this->m_po_double_uniform_location);
      break;
    case UNIFORM_FUNCTION_1DV:
      (**(code **)(lVar2 + 0x14d8))(this->m_po_double_uniform_location,1,auStack_228);
      break;
    case UNIFORM_FUNCTION_2D:
      (**(code **)(lVar2 + 0x1510))(0,0x3ff0000000000000,this->m_po_dvec2_uniform_location);
      break;
    case UNIFORM_FUNCTION_2DV:
      (**(code **)(lVar2 + 0x1518))(this->m_po_dvec2_uniform_location,1,auStack_228);
      break;
    case UNIFORM_FUNCTION_3D:
      (**(code **)(lVar2 + 0x1550))
                (0,0x3ff0000000000000,0x4000000000000000,this->m_po_dvec3_uniform_location);
      break;
    case UNIFORM_FUNCTION_3DV:
      (**(code **)(lVar2 + 0x1558))(this->m_po_dvec3_uniform_location,1,auStack_228);
      break;
    case UNIFORM_FUNCTION_4D:
      (**(code **)(lVar2 + 0x1590))
                (0,0x3ff0000000000000,0x4000000000000000,0x4008000000000000,
                 this->m_po_dvec4_uniform_location);
      break;
    case UNIFORM_FUNCTION_4DV:
      (**(code **)(lVar2 + 0x1598))(this->m_po_dvec4_uniform_location,1,auStack_228);
      break;
    case UNIFORM_FUNCTION_MATRIX2DV:
      (**(code **)(lVar2 + 0x15d8))(this->m_po_dmat2_uniform_location,1,0,auStack_228);
      break;
    case UNIFORM_FUNCTION_MATRIX2X3DV:
      (**(code **)(lVar2 + 0x15e8))(this->m_po_dmat2x3_uniform_location,1,0,auStack_228);
      break;
    case UNIFORM_FUNCTION_MATRIX2X4DV:
      (**(code **)(lVar2 + 0x15f8))(this->m_po_dmat2x4_uniform_location,1,0,auStack_228);
      break;
    case UNIFORM_FUNCTION_MATRIX3DV:
      (**(code **)(lVar2 + 0x1608))(this->m_po_dmat3_uniform_location,1,0,auStack_228);
      break;
    case UNIFORM_FUNCTION_MATRIX3X2DV:
      (**(code **)(lVar2 + 0x1618))(this->m_po_dmat3x2_uniform_location,1,0,auStack_228);
      break;
    case UNIFORM_FUNCTION_MATRIX3X4DV:
      (**(code **)(lVar2 + 0x1628))(this->m_po_dmat3x4_uniform_location,1,0,auStack_228);
      break;
    case UNIFORM_FUNCTION_MATRIX4DV:
      (**(code **)(lVar2 + 0x1638))(this->m_po_dmat4_uniform_location,1,0,auStack_228);
      break;
    case UNIFORM_FUNCTION_MATRIX4X2DV:
      (**(code **)(lVar2 + 0x1648))(this->m_po_dmat4x2_uniform_location,1,0,auStack_228);
      break;
    case UNIFORM_FUNCTION_MATRIX4X3DV:
      (**(code **)(lVar2 + 0x1658))(this->m_po_dmat4x3_uniform_location,1,0,auStack_228);
      break;
    default:
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Unrecognized uniform function",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0xc95);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    iVar1 = (**(code **)(lVar2 + 0x800))();
    if (iVar1 != 0x502) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      this_02 = this_00;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Implementation did not return GL_INVALID_OPERATION when ",0x38)
      ;
      __s = getUniformFunctionString(this_02,func);
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"() was called without an active program object",0x2e);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      std::ios_base::~ios_base(local_138);
      bVar7 = false;
    }
    func = func + UNIFORM_FUNCTION_1DV;
  } while (func != UNIFORM_FUNCTION_COUNT);
  return bVar7;
}

Assistant:

bool GPUShaderFP64Test1::verifyErrorGenerationWhenUniformFunctionsCalledWithoutActivePO()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	for (int function = static_cast<int>(UNIFORM_FUNCTION_FIRST); function < static_cast<int>(UNIFORM_FUNCTION_COUNT);
		 function++)
	{
		const double data[] = { 1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0, 8.0, 9.0, 10.0, 11.0, 12.0, 13.0, 14.0, 15.0 };

		switch (static_cast<_uniform_function>(function))
		{
		case UNIFORM_FUNCTION_1D:
			gl.uniform1d(m_po_double_uniform_location, 0.0);
			break;
		case UNIFORM_FUNCTION_1DV:
			gl.uniform1dv(m_po_double_uniform_location, 1, data);
			break;
		case UNIFORM_FUNCTION_2D:
			gl.uniform2d(m_po_dvec2_uniform_location, 0.0, 1.0);
			break;
		case UNIFORM_FUNCTION_2DV:
			gl.uniform2dv(m_po_dvec2_uniform_location, 1, data);
			break;
		case UNIFORM_FUNCTION_3D:
			gl.uniform3d(m_po_dvec3_uniform_location, 0.0, 1.0, 2.0);
			break;
		case UNIFORM_FUNCTION_3DV:
			gl.uniform3dv(m_po_dvec3_uniform_location, 1, data);
			break;
		case UNIFORM_FUNCTION_4D:
			gl.uniform4d(m_po_dvec4_uniform_location, 0.0, 1.0, 2.0, 3.0);
			break;
		case UNIFORM_FUNCTION_4DV:
			gl.uniform4dv(m_po_dvec4_uniform_location, 1, data);
			break;

		case UNIFORM_FUNCTION_MATRIX2DV:
			gl.uniformMatrix2dv(m_po_dmat2_uniform_location, 1, GL_FALSE /* transpose */, data);
			break;
		case UNIFORM_FUNCTION_MATRIX2X3DV:
			gl.uniformMatrix2x3dv(m_po_dmat2x3_uniform_location, 1, GL_FALSE /* transpose */, data);
			break;
		case UNIFORM_FUNCTION_MATRIX2X4DV:
			gl.uniformMatrix2x4dv(m_po_dmat2x4_uniform_location, 1, GL_FALSE /* transpose */, data);
			break;
		case UNIFORM_FUNCTION_MATRIX3DV:
			gl.uniformMatrix3dv(m_po_dmat3_uniform_location, 1, GL_FALSE /* transpose */, data);
			break;
		case UNIFORM_FUNCTION_MATRIX3X2DV:
			gl.uniformMatrix3x2dv(m_po_dmat3x2_uniform_location, 1, GL_FALSE /* transpose */, data);
			break;
		case UNIFORM_FUNCTION_MATRIX3X4DV:
			gl.uniformMatrix3x4dv(m_po_dmat3x4_uniform_location, 1, GL_FALSE /* transpose */, data);
			break;
		case UNIFORM_FUNCTION_MATRIX4DV:
			gl.uniformMatrix4dv(m_po_dmat4_uniform_location, 1, GL_FALSE /* transpose */, data);
			break;
		case UNIFORM_FUNCTION_MATRIX4X2DV:
			gl.uniformMatrix4x2dv(m_po_dmat4x2_uniform_location, 1, GL_FALSE /* transpose */, data);
			break;
		case UNIFORM_FUNCTION_MATRIX4X3DV:
			gl.uniformMatrix4x3dv(m_po_dmat4x3_uniform_location, 1, GL_FALSE /* transpose */, data);
			break;

		default:
		{
			TCU_FAIL("Unrecognized uniform function");
		}
		} /* switch (func) */

		/* Query the error code */
		glw::GLenum error_code = gl.getError();

		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Implementation did not return GL_INVALID_OPERATION when "
							   << getUniformFunctionString(static_cast<_uniform_function>(function))
							   << "() was called without an active program object" << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all uniform functions) */

	return result;
}